

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O0

void __thiscall sfc::Palette::save_act(Palette *this,string *path)

{
  channel_t cVar1;
  channel_t cVar2;
  bool bVar3;
  reference this_00;
  reference pvVar4;
  int local_f8;
  rgba_color local_f4;
  reference puStack_f0;
  rgba_color rgba;
  uint *c;
  iterator __end2;
  iterator __begin2;
  rgba_vec_t *__range2;
  rgba_vec_t colors;
  Subpalette spp;
  Subpalette *sp;
  const_iterator __end1;
  const_iterator __begin1;
  vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *__range1;
  int count;
  allocator<unsigned_char> local_31;
  undefined1 local_30 [8];
  byte_vec_t data;
  string *path_local;
  Palette *this_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)path;
  std::allocator<unsigned_char>::allocator(&local_31);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x304,&local_31);
  std::allocator<unsigned_char>::~allocator(&local_31);
  __range1._0_4_ = 0;
  __end1 = std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::begin
                     (&this->_subpalettes);
  sp = (Subpalette *)
       std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::end(&this->_subpalettes);
  while (bVar3 = __gnu_cxx::
                 operator==<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
                           (&__end1,(__normal_iterator<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
                                     *)&sp), ((bVar3 ^ 0xffU) & 1) != 0) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
              ::operator*(&__end1);
    Subpalette::padded((Subpalette *)
                       &colors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,this_00);
    Subpalette::normalized_colors
              ((rgba_vec_t *)&__range2,
               (Subpalette *)
               &colors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
    c = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
    while (bVar3 = __gnu_cxx::
                   operator==<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             (&__end2,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                       *)&c), ((bVar3 ^ 0xffU) & 1) != 0) {
      puStack_f0 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&__end2);
      rgba_color::rgba_color(&local_f4,*puStack_f0);
      cVar1 = local_f4.r;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                          (long)((int)__range1 * 3));
      cVar2 = local_f4.g;
      *pvVar4 = cVar1;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                          (long)((int)__range1 * 3 + 1));
      cVar1 = local_f4.b;
      *pvVar4 = cVar2;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                          (long)((int)__range1 * 3 + 2));
      *pvVar4 = cVar1;
      __range1._0_4_ = (int)__range1 + 1;
      if (0x100 < (int)__range1) {
        local_f8 = 6;
        goto LAB_001953c7;
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&__end2);
    }
    local_f8 = 0;
LAB_001953c7:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
    Subpalette::~Subpalette
              ((Subpalette *)
               &colors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_f8 != 0) break;
    __gnu_cxx::
    __normal_iterator<const_sfc::Subpalette_*,_std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>_>
    ::operator++(&__end1);
  }
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x300);
  *pvVar4 = '\0';
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x301);
  *pvVar4 = (value_type)__range1;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x303);
  *pvVar4 = 0xff;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x302);
  *pvVar4 = 0xff;
  write_file<unsigned_char>
            ((string *)
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

void Palette::save_act(const std::string& path) const {
  byte_vec_t data((256 * 3) + 4);
  int count = 0;

  for (const auto& sp : _subpalettes) {
    Subpalette spp = sp.padded();
    rgba_vec_t colors = spp.normalized_colors();
    for (const auto& c : colors) {
      rgba_color rgba(c);
      data[count * 3 + 0] = rgba.r;
      data[count * 3 + 1] = rgba.g;
      data[count * 3 + 2] = rgba.b;
      if (++count > 256)
        goto done;
    }
  }

done:
  data[0x300] = 0x00;
  data[0x301] = count & 0xff;
  data[0x302] = data[0x303] = 0xff;
  write_file(path, data);
}